

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

void __thiscall tonk::Connection::setPeerAddress(Connection *this,UDPAddress *peerUDPAddress)

{
  Lock *__mutex;
  ostringstream *this_00;
  ConnectionAddrMap *this_01;
  undefined8 uVar1;
  bool bVar2;
  uint16_t port;
  int iVar3;
  OutputWorker *this_02;
  address local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1a8 [7];
  ios_base local_138 [264];
  
  this_01 = (this->Deps).AddressMap;
  __mutex = &(this->Outgoing).PrivateLock;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    local_1b8._0_8_ = *(undefined8 *)&(this->Outgoing).PeerUDPAddress.impl_.data_;
    uVar1 = *(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 8);
    aaStack_1a8[0]._4_8_ =
         *(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 0x14);
    aaStack_1a8[0]._M_allocated_capacity._0_4_ =
         (undefined4)
         ((ulong)*(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 0xc) >> 0x20);
    local_1b8._8_4_ = (undefined4)uVar1;
    local_1b8._12_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    bVar2 = ConnectionAddrMap::ChangeAddress
                      (this_01,(UDPAddress *)local_1b8,peerUDPAddress,&this->super_IConnection);
    if (!bVar2) {
      if ((peerUDPAddress->impl_).data_.base.sa_family == 2) {
        local_1f8._0_8_ = (ulong)(peerUDPAddress->impl_).data_.v6.sin6_flowinfo << 0x20;
        local_1f8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_1f8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_1f8.ipv6_address_.scope_id_ = 0;
      }
      else {
        local_1f8.ipv6_address_.addr_.__in6_u._0_8_ =
             *(undefined8 *)((long)&(peerUDPAddress->impl_).data_ + 8);
        local_1f8.ipv6_address_.addr_.__in6_u._8_8_ =
             *(undefined8 *)((long)&(peerUDPAddress->impl_).data_ + 0x10);
        local_1f8.ipv6_address_.scope_id_ =
             (unsigned_long)(peerUDPAddress->impl_).data_.v6.sin6_scope_id;
        local_1f8.type_ = ipv6;
        local_1f8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      }
      asio::ip::address::to_string_abi_cxx11_(&local_1d8,&local_1f8);
      if ((int)(this->Logger).ChannelMinLevel < 4) {
        swap_bytes((peerUDPAddress->impl_).data_.v4.sin_port);
        local_1b8._0_8_ = (this->Logger).ChannelName;
        this_00 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._8_4_ = 3;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(this->Logger).Prefix._M_dataplus._M_p,
                   (this->Logger).Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Unable to change address (already taken in map): ",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,":",1);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        this_02 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_02,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
    }
    SessionOutgoing::SetPeerUDPAddress(&this->Outgoing,peerUDPAddress);
    queueAddressAndIdChangeMessage(this,peerUDPAddress);
    if ((peerUDPAddress->impl_).data_.base.sa_family == 2) {
      local_1f8._0_8_ = (ulong)(peerUDPAddress->impl_).data_.v6.sin6_flowinfo << 0x20;
      local_1f8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_1f8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_1f8.ipv6_address_.scope_id_ = 0;
    }
    else {
      local_1f8.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(peerUDPAddress->impl_).data_ + 8);
      local_1f8.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(peerUDPAddress->impl_).data_ + 0x10);
      local_1f8.ipv6_address_.scope_id_ =
           (unsigned_long)(peerUDPAddress->impl_).data_.v6.sin6_scope_id;
      local_1f8.type_ = ipv6;
      local_1f8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    }
    asio::ip::address::to_string_abi_cxx11_(&local_1d8,&local_1f8);
    port = swap_bytes((peerUDPAddress->impl_).data_.v4.sin_port);
    GetConnectionLogPrefix((string *)local_1b8,&local_1d8,port);
    logger::Channel::SetPrefix(&this->Logger,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void Connection::setPeerAddress(const UDPAddress& peerUDPAddress)
{
    const bool insertSuccess = Deps.AddressMap->ChangeAddress(
        Outgoing.GetPeerUDPAddress(),
        peerUDPAddress,
        this);

    // If unable to insert the address because it is already listed:
    if (!insertSuccess)
    {
        Logger.Warning("Unable to change address (already taken in map): ",
            peerUDPAddress.address().to_string(), ":", peerUDPAddress.port());
    }

    Outgoing.SetPeerUDPAddress(peerUDPAddress);

    queueAddressAndIdChangeMessage(peerUDPAddress);

    Logger.SetPrefix(GetConnectionLogPrefix(
        peerUDPAddress.address().to_string(),
        peerUDPAddress.port()));
}